

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::next(Session *this,Message *message,UtcTimeStamp *now,bool queued)

{
  Header *this_00;
  bool bVar1;
  int iVar2;
  FieldBase *pFVar3;
  FieldBase *value;
  DataDictionary *this_01;
  DataDictionary *pAppDD;
  FieldNotFound *pFVar4;
  UnsupportedVersion *this_02;
  UtcTimeStamp *now_00;
  UtcTimeStamp *now_01;
  UtcTimeStamp *now_02;
  uchar *in_R8;
  size_t in_R9;
  string *__lhs;
  allocator<char> local_a1 [9];
  ApplVerID applVerID;
  
  this_00 = &message->m_header;
  bVar1 = checkSessionTime(this,now);
  if (!bVar1) {
    reset(this);
    return;
  }
  pFVar3 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x23);
  value = FieldMap::getFieldRef(&this_00->super_FieldMap,8);
  bVar1 = FieldMap::isSetField(&this_00->super_FieldMap,0x31);
  if (!bVar1) {
    pFVar4 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&applVerID,"",local_a1);
    FieldNotFound::FieldNotFound(pFVar4,0x31,(string *)&applVerID);
    __cxa_throw(pFVar4,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  bVar1 = FieldMap::isSetField(&this_00->super_FieldMap,0x38);
  if (!bVar1) {
    pFVar4 = (FieldNotFound *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>((string *)&applVerID,"",local_a1);
    FieldNotFound::FieldNotFound(pFVar4,0x38,(string *)&applVerID);
    __cxa_throw(pFVar4,&FieldNotFound::typeinfo,Exception::~Exception);
  }
  bVar1 = std::operator!=(&value->m_string,
                          &(this->m_sessionID).m_beginString.super_StringField.super_FieldBase.
                           m_string);
  if (!bVar1) {
    __lhs = &pFVar3->m_string;
    bVar1 = std::operator==(__lhs,"A");
    if (bVar1) {
      if ((this->m_sessionID).m_isFIXT == true) {
        FieldMap::getFieldRef(&message->super_FieldMap,0x471);
        std::__cxx11::string::_M_assign((string *)&this->m_targetDefaultApplVerID);
      }
      else {
        Message::toApplVerID(&applVerID,(BeginString *)value);
        std::__cxx11::string::_M_assign((string *)&this->m_targetDefaultApplVerID);
        FieldBase::~FieldBase((FieldBase *)&applVerID);
      }
    }
    this_01 = DataDictionaryProvider::getSessionDataDictionary
                        (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
    if (((this->m_sessionID).m_isFIXT == true) && (bVar1 = Message::isApp(message), bVar1)) {
      ApplVerID::ApplVerID(&applVerID,&this->m_targetDefaultApplVerID);
      FieldMap::getFieldIfSet(&this_00->super_FieldMap,(FieldBase *)&applVerID);
      pAppDD = DataDictionaryProvider::getApplicationDataDictionary
                         (&this->m_dataDictionaryProvider,&applVerID);
      DataDictionary::validate(message,this_01,pAppDD);
      FieldBase::~FieldBase((FieldBase *)&applVerID);
    }
    else {
      DataDictionary::validate(this_01,message);
    }
    bVar1 = std::operator==(__lhs,"A");
    if (bVar1) {
      nextLogon(this,message,now);
    }
    else {
      bVar1 = std::operator==(__lhs,"0");
      if (bVar1) {
        nextHeartbeat(this,message,now);
      }
      else {
        bVar1 = std::operator==(__lhs,"1");
        if (bVar1) {
          nextTestRequest(this,message,now);
        }
        else {
          bVar1 = std::operator==(__lhs,"4");
          if (bVar1) {
            nextSequenceReset(this,message,now_00);
          }
          else {
            bVar1 = std::operator==(__lhs,"5");
            if (bVar1) {
              nextLogout(this,message,now_01);
            }
            else {
              bVar1 = std::operator==(__lhs,"2");
              if (bVar1) {
                nextResendRequest(this,message,now_02);
              }
              else {
                bVar1 = std::operator==(__lhs,"3");
                if (bVar1) {
                  nextReject(this,message,now);
                }
                else {
                  iVar2 = verify(this,(EVP_PKEY_CTX *)message,(uchar *)0x1,1,in_R8,in_R9);
                  if ((char)iVar2 == '\0') {
                    return;
                  }
                  SessionState::incrNextTargetMsgSeqNum(&this->m_state);
                }
              }
            }
          }
        }
      }
    }
    if (!queued) {
      nextQueued(this,now);
    }
    if (((this->m_state).m_receivedLogon == true) && (((this->m_state).m_sentLogon & 1U) != 0)) {
      std::function<FIX::UtcTimeStamp_()>::operator()
                ((UtcTimeStamp *)&applVerID,&this->m_timestamper);
      next(this,(UtcTimeStamp *)&applVerID);
    }
    return;
  }
  this_02 = (UnsupportedVersion *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&applVerID,"",local_a1);
  UnsupportedVersion::UnsupportedVersion(this_02,(string *)&applVerID);
  __cxa_throw(this_02,&UnsupportedVersion::typeinfo,Exception::~Exception);
}

Assistant:

void Session::next(const Message &message, const UtcTimeStamp &now, bool queued) {
  const Header &header = message.getHeader();

  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    const MsgType &msgType = FIELD_GET_REF(header, MsgType);
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    // make sure these fields are present
    FIELD_THROW_IF_NOT_FOUND(header, SenderCompID);
    FIELD_THROW_IF_NOT_FOUND(header, TargetCompID);

    if (beginString != m_sessionID.getBeginString()) {
      throw UnsupportedVersion();
    }

    if (msgType == MsgType_Logon) {
      if (m_sessionID.isFIXT()) {
        const DefaultApplVerID &applVerID = FIELD_GET_REF(message, DefaultApplVerID);
        setTargetDefaultApplVerID(applVerID);
      } else {
        setTargetDefaultApplVerID(Message::toApplVerID(beginString));
      }
    }

    const DataDictionary &sessionDataDictionary
        = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

    if (m_sessionID.isFIXT() && message.isApp()) {
      ApplVerID applVerID = m_targetDefaultApplVerID;
      header.getFieldIfSet(applVerID);
      const DataDictionary &applicationDataDictionary
          = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      DataDictionary::validate(message, &sessionDataDictionary, &applicationDataDictionary);
    } else {
      sessionDataDictionary.validate(message);
    }

    if (msgType == MsgType_Logon) {
      nextLogon(message, now);
    } else if (msgType == MsgType_Heartbeat) {
      nextHeartbeat(message, now);
    } else if (msgType == MsgType_TestRequest) {
      nextTestRequest(message, now);
    } else if (msgType == MsgType_SequenceReset) {
      nextSequenceReset(message, now);
    } else if (msgType == MsgType_Logout) {
      nextLogout(message, now);
    } else if (msgType == MsgType_ResendRequest) {
      nextResendRequest(message, now);
    } else if (msgType == MsgType_Reject) {
      nextReject(message, now);
    } else {
      if (!verify(message)) {
        return;
      }
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (MessageParseError &e) {
    m_state.onEvent(e.what());
  } catch (RequiredTagMissing &e) {
    LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
  } catch (FieldNotFound &e) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42 && message.isApp()) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING, e.field));
    } else {
      LOGEX(generateReject(message, SessionRejectReason_REQUIRED_TAG_MISSING, e.field));
      if (header.getField(FIELD::MsgType) == MsgType_Logon) {
        m_state.onEvent("Required field missing from logon");
        disconnect();
      }
    }
  } catch (InvalidTagNumber &e) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_TAG_NUMBER, e.field));
  } catch (NoTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_WITHOUT_A_VALUE, e.field));
  } catch (TagNotDefinedForMessage &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_NOT_DEFINED_FOR_THIS_MESSAGE_TYPE, e.field));
  } catch (InvalidMessageType &) {
    LOGEX(generateReject(message, SessionRejectReason_INVALID_MSGTYPE));
  } catch (UnsupportedMessageType &) {
    if (header.getField(FIELD::BeginString) >= FIX::BeginString_FIX42) {
      LOGEX(generateBusinessReject(message, BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE));
    } else {
      LOGEX(generateReject(message, "Unsupported message type"));
    }
  } catch (TagOutOfOrder &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_SPECIFIED_OUT_OF_REQUIRED_ORDER, e.field));
  } catch (IncorrectDataFormat &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_DATA_FORMAT_FOR_VALUE, e.field));
  } catch (IncorrectTagValue &e) {
    LOGEX(generateReject(message, SessionRejectReason_VALUE_IS_INCORRECT, e.field));
  } catch (RepeatedTag &e) {
    LOGEX(generateReject(message, SessionRejectReason_TAG_APPEARS_MORE_THAN_ONCE, e.field));
  } catch (RepeatingGroupCountMismatch &e) {
    LOGEX(generateReject(message, SessionRejectReason_INCORRECT_NUMINGROUP_COUNT_FOR_REPEATING_GROUP, e.field));
  } catch (InvalidMessage &e) {
    m_state.onEvent(e.what());
  } catch (RejectLogon &e) {
    m_state.onEvent(e.what());
    generateLogout(e.what());
    disconnect();
  } catch (UnsupportedVersion &) {
    if (header.getField(FIELD::MsgType) == MsgType_Logout) {
      nextLogout(message, now);
    } else {
      generateLogout("Incorrect BeginString");
      m_state.incrNextTargetMsgSeqNum();
    }
  } catch (IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }

  if (!queued) {
    nextQueued(now);
  }

  if (isLoggedOn()) {
    next(m_timestamper());
  }
}